

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  bool bVar1;
  int y;
  int z;
  Vec3 *s;
  int lodOffsNdx;
  long lVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float wy;
  float width;
  float height;
  float fVar7;
  float fVar8;
  float fVar9;
  Texture1DView TVar10;
  Vec2 lodBounds;
  Vec2 clampedLod;
  Vec2 lodBias;
  Vec4 refPix;
  Vec4 resPix;
  Texture1DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodO;
  float local_190;
  int local_17c;
  float local_16c;
  Vec2 local_150;
  float local_144;
  float local_140;
  float local_13c;
  undefined1 local_138 [24];
  ConstPixelBufferAccess *local_120;
  Vec4 *local_118;
  Vec4 *local_110;
  Vector<bool,_4> local_108 [2];
  Vector<float,_2> local_100;
  Vector<float,_4> local_f8;
  Vec4 local_e8;
  Sampler *local_d8;
  Vec4 *local_d0;
  Texture1DView local_c8;
  undefined1 local_b8 [8];
  ConstPixelBufferAccess *pCStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Vec3 local_98;
  float fStack_8c;
  undefined8 local_88;
  Vec3 local_78;
  float fStack_6c;
  undefined8 local_68;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_58;
  TextureFormat local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._16_8_ = errorMask;
  TVar10 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  pCStack_b0 = TVar10.m_levels;
  local_b8._0_4_ = TVar10.m_numLevels;
  local_d8 = &sampleParams->sampler;
  TVar10 = tcu::getEffectiveTextureView
                     ((Texture1DView *)local_b8,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&local_58,local_d8);
  local_c8.m_levels = TVar10.m_levels;
  local_c8.m_numLevels = TVar10.m_numLevels;
  local_78.m_data[0] = *texCoord;
  local_78.m_data[1] = texCoord[1];
  local_78.m_data[2] = texCoord[2];
  fStack_6c = texCoord[3];
  local_100.m_data[0] = 0.0;
  local_190 = 0.0;
  if (0 < local_c8.m_numLevels) {
    local_190 = (float)((local_c8.m_levels)->m_size).m_data[0];
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_68 = CONCAT44(local_78.m_data[1],local_78.m_data[2]);
  local_98.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_98.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_98.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_8c = (sampleParams->super_RenderParams).w.m_data[3];
  local_88 = CONCAT44(local_98.m_data[1],local_98.m_data[2]);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_100.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_b8 = (undefined1  [8])0xbf800000;
  pCStack_b0 = (ConstPixelBufferAccess *)0x3f800000;
  local_a8 = 0xbf80000000000000;
  uStack_a0 = 0x3f80000000000000;
  local_f8.m_data[0] = -1.7146522e+38;
  local_100.m_data[1] = local_100.m_data[0];
  tcu::RGBA::toVec((RGBA *)&local_f8);
  tcu::clear((PixelBufferAccess *)local_138._16_8_,&local_e8);
  local_110 = &(sampleParams->super_RenderParams).colorBias;
  local_118 = &(sampleParams->super_RenderParams).colorScale;
  local_d0 = &lookupPrec->colorThreshold;
  local_17c = 0;
  local_120 = reference;
  for (z = 0; z < (result->m_size).m_data[1]; z = z + 1) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    wy = (float)z + 0.5;
    fVar7 = wy / height;
    local_140 = height - wy;
    local_144 = 1.0 - fVar7;
    for (y = 0; y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)result,y,z);
      tcu::operator-((tcu *)&local_f8,(Vector<float,_4> *)&stack0xffffffffffffffc0,local_110);
      tcu::operator/((tcu *)&local_e8,&local_f8,local_118);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_138,(int)reference,y,z);
      tcu::operator-((tcu *)&stack0xffffffffffffffc0,(Vector<float,_4> *)local_138,local_110);
      tcu::operator/((tcu *)&local_f8,(Vector<float,_4> *)&stack0xffffffffffffffc0,local_118);
      tcu::operator-((tcu *)local_138,&local_e8,&local_f8);
      tcu::abs<float,4>((tcu *)&stack0xffffffffffffffc0,(Vector<float,_4> *)local_138);
      tcu::lessThanEqual<float,4>
                ((tcu *)local_108,(Vector<float,_4> *)&stack0xffffffffffffffc0,local_d0);
      bVar1 = tcu::boolAll<4>(local_108);
      if (!bVar1) {
        fVar9 = (float)y + 0.5;
        fVar8 = fVar9 / width;
        bVar1 = 1.0 <= fVar7 + fVar8;
        fVar5 = wy;
        local_16c = fVar9;
        if (bVar1) {
          fVar5 = local_140;
          local_16c = width - fVar9;
        }
        fVar6 = fVar7;
        if (bVar1) {
          fVar8 = 1.0 - fVar8;
          fVar6 = local_144;
        }
        s = &local_78 + bVar1;
        w = &local_98 + bVar1;
        local_13c = projectedTriInterpolate(s,w,fVar8,fVar6);
        fVar9 = triDerivateX(s,w,fVar9,width,fVar6);
        fVar8 = triDerivateY(s,w,wy,height,fVar8);
        tcu::computeLodBoundsFromDerivates
                  ((tcu *)local_138,fVar9 * local_190,fVar8 * local_190,lodPrec);
        for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
          fVar8 = *(float *)(local_b8 + lVar2 * 8);
          fVar9 = *(float *)(local_b8 + lVar2 * 8 + 4);
          fVar6 = triDerivateX(s,w,fVar8 + local_16c,width,(fVar9 + fVar5) / height);
          fVar8 = triDerivateY(s,w,fVar9 + fVar5,height,(fVar8 + local_16c) / width);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&stack0xffffffffffffffc0,fVar6 * local_190,fVar8 * local_190,lodPrec);
          uVar3 = -(uint)((float)local_138._0_4_ <= (float)local_40.order);
          uVar4 = -(uint)((float)local_40.type <= (float)local_138._4_4_);
          local_138._0_4_ = ~uVar3 & local_40.order | local_138._0_4_ & uVar3;
          local_138._4_4_ = ~uVar4 & local_40.type | local_138._4_4_ & uVar4;
        }
        tcu::operator+((Vector<float,_2> *)local_138,&local_100);
        local_150.m_data[0] = sampleParams->minLod;
        local_150.m_data[1] = sampleParams->maxLod;
        tcu::clampLodBounds((tcu *)local_108,(Vec2 *)&stack0xffffffffffffffc0,&local_150,lodPrec);
        bVar1 = tcu::isLookupResultValid
                          (&local_c8,local_d8,lookupPrec,local_13c,(Vec2 *)local_108,&local_e8);
        reference = local_120;
        if (!bVar1) {
          local_150.m_data[0] = -1.7014636e+38;
          tcu::RGBA::toVec((RGBA *)&local_150);
          reference = local_120;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_138._16_8_,(Vec4 *)&stack0xffffffffffffffc0,y,z,0);
          local_17c = local_17c + 1;
        }
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_58);
  return local_17c;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const float		coord		= projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy);
				const float		coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * float(srcSize);
				const float		coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * float(srcSize);

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo	= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * float(srcSize);
					const float	coordDyo	= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * float(srcSize);
					const tcu::Vec2	lodO	= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}